

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDimple * __thiscall ON_SubD::SubDimple(ON_SubD *this,bool bCreateIfNeeded)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  ON_SubDimple *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_01 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_01 == (ON_SubDimple *)0x0 && bCreateIfNeeded) {
    this_01 = (ON_SubDimple *)operator_new(0x810);
    ON_SubDimple::ON_SubDimple(this_01);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ON_SubDimple*>
              (&_Stack_20,this_01);
    _Var1._M_pi = _Stack_20._M_pi;
    _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
    (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         this_01;
    (this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var1._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (_Stack_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_20._M_pi);
    }
  }
  return this_01;
}

Assistant:

ON_SubDimple* ON_SubD::SubDimple(bool bCreateIfNeeded)
{
  ON_SubDimple* subdimple = m_subdimple_sp.get();
  if (nullptr == subdimple && bCreateIfNeeded)
  {
    subdimple = new ON_SubDimple();
    m_subdimple_sp = std::shared_ptr<ON_SubDimple>(subdimple);
  }
  return subdimple;
}